

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_text(nk_command_buffer *b,nk_rect r,char *string,int length,nk_user_font *font,
                 nk_color bg,nk_color fg)

{
  float fVar1;
  float local_60;
  int local_5c;
  float txt_width;
  int glyphs;
  nk_rect *c;
  nk_command_text *cmd;
  nk_user_font *pnStack_40;
  float text_width;
  nk_user_font *font_local;
  char *pcStack_30;
  int length_local;
  char *string_local;
  nk_command_buffer *b_local;
  nk_color fg_local;
  nk_color bg_local;
  nk_rect r_local;
  
  _fg_local = r._0_8_;
  cmd._4_4_ = 0.0;
  pnStack_40 = font;
  font_local._4_4_ = (float)length;
  pcStack_30 = string;
  string_local = (char *)b;
  b_local._0_4_ = fg;
  b_local._4_4_ = bg;
  if (b == (nk_command_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x23d8,
                  "void nk_draw_text(struct nk_command_buffer *, struct nk_rect, const char *, int, const struct nk_user_font *, struct nk_color, struct nk_color)"
                 );
  }
  if (font == (nk_user_font *)0x0) {
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x23d9,
                  "void nk_draw_text(struct nk_command_buffer *, struct nk_rect, const char *, int, const struct nk_user_font *, struct nk_color, struct nk_color)"
                 );
  }
  if ((((b != (nk_command_buffer *)0x0) && (string != (char *)0x0)) && (length != 0)) &&
     ((b_local._7_1_ = bg.a, b_local._7_1_ != '\0' || (b_local._3_1_ = fg.a, b_local._3_1_ != '\0'))
     )) {
    r_local.x = r.w;
    r_local.y = r.h;
    if (b->use_clipping != 0) {
      _txt_width = &b->clip;
      fVar1 = (b->clip).w;
      if ((fVar1 == 0.0) && (!NAN(fVar1))) {
        return;
      }
      fVar1 = (b->clip).h;
      if ((fVar1 == 0.0) && (!NAN(fVar1))) {
        return;
      }
      fg_local = (nk_color)r.x;
      if ((float)fg_local + r_local.x < _txt_width->x) {
        return;
      }
      if (_txt_width->x + (b->clip).w < (float)fg_local) {
        return;
      }
      bg_local = (nk_color)r.y;
      if ((float)bg_local + r_local.y < (b->clip).y) {
        return;
      }
      if ((b->clip).y + (b->clip).h < (float)bg_local) {
        return;
      }
    }
    cmd._4_4_ = (*font->width)(font->userdata,font->height,string,length);
    if (r_local.x < cmd._4_4_) {
      local_5c = 0;
      local_60 = cmd._4_4_;
      font_local._4_4_ =
           (float)nk_text_clamp(pnStack_40,pcStack_30,(int)font_local._4_4_,r_local.x,&local_5c,
                                &local_60,(nk_rune *)0x0,0);
    }
    if ((font_local._4_4_ != 0.0) &&
       (c = (nk_rect *)
            nk_command_buffer_push
                      ((nk_command_buffer *)string_local,NK_COMMAND_TEXT,
                       (long)((int)font_local._4_4_ + 1) + 0x38), c != (nk_rect *)0x0)) {
      *(short *)&c[2].x = (short)(int)(float)fg_local;
      *(short *)((long)&c[2].x + 2) = (short)(int)(float)bg_local;
      *(short *)&c[2].y = (short)(int)r_local.x;
      *(short *)((long)&c[2].y + 2) = (short)(int)r_local.y;
      c[1].w = (float)b_local._4_4_;
      c[1].h = (float)b_local._0_4_;
      *(nk_user_font **)(c + 1) = pnStack_40;
      c[2].h = font_local._4_4_;
      c[2].w = pnStack_40->height;
      nk_memcopy(c + 3,pcStack_30,(long)(int)font_local._4_4_);
      *(undefined1 *)((long)&c[3].x + (long)(int)font_local._4_4_) = 0;
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_text(struct nk_command_buffer *b, struct nk_rect r,
    const char *string, int length, const struct nk_user_font *font,
    struct nk_color bg, struct nk_color fg)
{
    float text_width = 0;
    struct nk_command_text *cmd;

    NK_ASSERT(b);
    NK_ASSERT(font);
    if (!b || !string || !length || (bg.a == 0 && fg.a == 0)) return;
    if (b->use_clipping) {
        const struct nk_rect *c = &b->clip;
        if (c->w == 0 || c->h == 0 || !NK_INTERSECT(r.x, r.y, r.w, r.h, c->x, c->y, c->w, c->h))
            return;
    }

    /* make sure text fits inside bounds */
    text_width = font->width(font->userdata, font->height, string, length);
    if (text_width > r.w){
        int glyphs = 0;
        float txt_width = (float)text_width;
        length = nk_text_clamp(font, string, length, r.w, &glyphs, &txt_width, 0,0);
    }

    if (!length) return;
    cmd = (struct nk_command_text*)
        nk_command_buffer_push(b, NK_COMMAND_TEXT, sizeof(*cmd) + (nk_size)(length + 1));
    if (!cmd) return;
    cmd->x = (short)r.x;
    cmd->y = (short)r.y;
    cmd->w = (unsigned short)r.w;
    cmd->h = (unsigned short)r.h;
    cmd->background = bg;
    cmd->foreground = fg;
    cmd->font = font;
    cmd->length = length;
    cmd->height = font->height;
    NK_MEMCPY(cmd->string, string, (nk_size)length);
    cmd->string[length] = '\0';
}